

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlPushInput(xmlParserCtxtPtr ctxt,xmlParserInputPtr input)

{
  uint uVar1;
  uint uVar2;
  xmlGenericErrorFunc p_Var3;
  xmlParserInputPtr *ppxVar4;
  xmlParserInputPtr input_00;
  int iVar5;
  int *piVar6;
  xmlGenericErrorFunc *pp_Var7;
  void **ppvVar8;
  int iVar9;
  
  iVar9 = -1;
  if (input != (xmlParserInputPtr)0x0) {
    piVar6 = __xmlParserDebugEntities();
    if (*piVar6 != 0) {
      if ((ctxt->input != (xmlParserInputPtr)0x0) && (ctxt->input->filename != (char *)0x0)) {
        pp_Var7 = __xmlGenericError();
        p_Var3 = *pp_Var7;
        ppvVar8 = __xmlGenericErrorContext();
        (*p_Var3)(*ppvVar8,"%s(%d): ",ctxt->input->filename,(ulong)(uint)ctxt->input->line);
      }
      pp_Var7 = __xmlGenericError();
      p_Var3 = *pp_Var7;
      ppvVar8 = __xmlGenericErrorContext();
      (*p_Var3)(*ppvVar8,"Pushing input %d : %.30s\n",(ulong)(ctxt->inputNr + 1),input->cur);
    }
    if ((ctxt->inputNr < 0x29) ||
       (((uint)ctxt->inputNr < 0x401 && ((ctxt->options & 0x80000U) != 0)))) {
      iVar5 = inputPush(ctxt,input);
      if ((ctxt->instate != XML_PARSER_EOF) &&
         ((iVar9 = iVar5, ctxt->progressive == 0 &&
          ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)))) {
        xmlGROW(ctxt);
      }
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
      uVar2 = ctxt->inputNr;
      while (1 < (int)uVar2) {
        uVar1 = uVar2 - 1;
        ctxt->inputNr = uVar1;
        ppxVar4 = ctxt->inputTab;
        ctxt->input = ppxVar4[(ulong)uVar2 - 2];
        input_00 = ppxVar4[uVar1];
        ppxVar4[uVar1] = (xmlParserInputPtr)0x0;
        xmlFreeInputStream(input_00);
        uVar2 = ctxt->inputNr;
      }
    }
  }
  return iVar9;
}

Assistant:

int
xmlPushInput(xmlParserCtxtPtr ctxt, xmlParserInputPtr input) {
    int ret;
    if (input == NULL) return(-1);

    if (xmlParserDebugEntities) {
	if ((ctxt->input != NULL) && (ctxt->input->filename))
	    xmlGenericError(xmlGenericErrorContext,
		    "%s(%d): ", ctxt->input->filename,
		    ctxt->input->line);
	xmlGenericError(xmlGenericErrorContext,
		"Pushing input %d : %.30s\n", ctxt->inputNr+1, input->cur);
    }
    if (((ctxt->inputNr > 40) && ((ctxt->options & XML_PARSE_HUGE) == 0)) ||
        (ctxt->inputNr > 1024)) {
        xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
        while (ctxt->inputNr > 1)
            xmlFreeInputStream(inputPop(ctxt));
	return(-1);
    }
    ret = inputPush(ctxt, input);
    if (ctxt->instate == XML_PARSER_EOF)
        return(-1);
    GROW;
    return(ret);
}